

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::OnCallSpec<int_(int)>::OnCallSpec
          (OnCallSpec<int_(int)> *this,char *a_file,int a_line,ArgumentMatcherTuple *matchers)

{
  (this->super_UntypedOnCallSpecBase).file_ = a_file;
  (this->super_UntypedOnCallSpecBase).line_ = a_line;
  (this->super_UntypedOnCallSpecBase).last_clause_ = kNone;
  Matcher<int>::Matcher((Matcher<int> *)&this->matchers_,(Matcher<int> *)matchers);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<int>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<int>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<int>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<int>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_001808d8;
  *(undefined8 *)&(this->action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

OnCallSpec(const char* a_file, int a_line,
             const ArgumentMatcherTuple& matchers)
      : UntypedOnCallSpecBase(a_file, a_line),
        matchers_(matchers),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()) {}